

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_NeuralNetwork_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NeuralNetwork>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::NeuralNetwork> *)
             _NeuralNetwork_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NeuralNetworkImageScaler>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::NeuralNetworkImageScaler> *)
             _NeuralNetworkImageScaler_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NeuralNetworkMeanImage>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::NeuralNetworkMeanImage> *)
           _NeuralNetworkMeanImage_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::NeuralNetworkPreprocessing>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::NeuralNetworkPreprocessing> *)
             _NeuralNetworkPreprocessing_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationReLU>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ActivationReLU> *)
             _ActivationReLU_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationLeakyReLU>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationLeakyReLU> *)
           _ActivationLeakyReLU_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationTanh>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ActivationTanh> *)
             _ActivationTanh_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationScaledTanh>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationScaledTanh> *)
           _ActivationScaledTanh_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationSigmoid>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationSigmoid> *)
           _ActivationSigmoid_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationLinear>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationLinear> *)
           _ActivationLinear_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationSigmoidHard>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationSigmoidHard> *)
           _ActivationSigmoidHard_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationPReLU>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationPReLU> *)
           _ActivationPReLU_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationELU>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ActivationELU> *)
             _ActivationELU_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ActivationThresholdedReLU>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ActivationThresholdedReLU> *)
             _ActivationThresholdedReLU_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationSoftsign>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationSoftsign> *)
           _ActivationSoftsign_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationSoftplus>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationSoftplus> *)
           _ActivationSoftplus_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ActivationParametricSoftplus>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ActivationParametricSoftplus> *)
             _ActivationParametricSoftplus_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ActivationParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ActivationParams> *)
           _ActivationParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Tensor>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Tensor> *)_Tensor_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NeuralNetworkLayer>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::NeuralNetworkLayer> *)
           _NeuralNetworkLayer_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BranchLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::BranchLayerParams> *)
           _BranchLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LoopLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LoopLayerParams> *)
           _LoopLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LoopBreakLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LoopBreakLayerParams> *)
           _LoopBreakLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LoopContinueLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::LoopContinueLayerParams> *)
             _LoopContinueLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CopyLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CopyLayerParams> *)
           _CopyLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GreaterThanLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::GreaterThanLayerParams> *)
           _GreaterThanLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GreaterEqualLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::GreaterEqualLayerParams> *)
             _GreaterEqualLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LessThanLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LessThanLayerParams> *)
           _LessThanLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LessEqualLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LessEqualLayerParams> *)
           _LessEqualLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::EqualLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::EqualLayerParams> *)
           _EqualLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NotEqualLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::NotEqualLayerParams> *)
           _NotEqualLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LogicalAndLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LogicalAndLayerParams> *)
           _LogicalAndLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LogicalOrLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LogicalOrLayerParams> *)
           _LogicalOrLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LogicalXorLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LogicalXorLayerParams> *)
           _LogicalXorLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LogicalNotLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LogicalNotLayerParams> *)
           _LogicalNotLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BorderAmounts_EdgeSizes>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::BorderAmounts_EdgeSizes> *)
             _BorderAmounts_EdgeSizes_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BorderAmounts>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::BorderAmounts> *)
             _BorderAmounts_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ValidPadding>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ValidPadding> *)
             _ValidPadding_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SamePadding>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SamePadding> *)
             _SamePadding_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SamplingMode>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SamplingMode> *)
             _SamplingMode_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BoxCoordinatesMode>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::BoxCoordinatesMode> *)
           _BoxCoordinatesMode_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::WeightParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::WeightParams> *)
             _WeightParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::QuantizationParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::QuantizationParams> *)
           _QuantizationParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinearQuantizationParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::LinearQuantizationParams> *)
             _LinearQuantizationParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::LookUpTableQuantizationParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LookUpTableQuantizationParams> *)
             _LookUpTableQuantizationParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ConvolutionLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ConvolutionLayerParams> *)
           _ConvolutionLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Convolution3DLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::Convolution3DLayerParams> *)
             _Convolution3DLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::InnerProductLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::InnerProductLayerParams> *)
             _InnerProductLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::EmbeddingLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::EmbeddingLayerParams> *)
           _EmbeddingLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::EmbeddingNDLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::EmbeddingNDLayerParams> *)
           _EmbeddingNDLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BatchnormLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::BatchnormLayerParams> *)
           _BatchnormLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::PoolingLayerParams_ValidCompletePadding>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::PoolingLayerParams_ValidCompletePadding>
              *)_PoolingLayerParams_ValidCompletePadding_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PoolingLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::PoolingLayerParams> *)
           _PoolingLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Pooling3DLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::Pooling3DLayerParams> *)
           _Pooling3DLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::GlobalPooling3DLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::GlobalPooling3DLayerParams> *)
             _GlobalPooling3DLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams_PaddingConstant>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams_PaddingConstant> *)
             _PaddingLayerParams_PaddingConstant_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams_PaddingReflection>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams_PaddingReflection> *)
             _PaddingLayerParams_PaddingReflection_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams_PaddingReplication>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams_PaddingReplication> *)
             _PaddingLayerParams_PaddingReplication_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::PaddingLayerParams> *)
           _PaddingLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ConcatLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ConcatLayerParams> *)
           _ConcatLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LRNLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LRNLayerParams> *)
             _LRNLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SoftmaxLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SoftmaxLayerParams> *)
           _SoftmaxLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SplitLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SplitLayerParams> *)
           _SplitLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AddLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::AddLayerParams> *)
             _AddLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MultiplyLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::MultiplyLayerParams> *)
           _MultiplyLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::UnaryFunctionLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::UnaryFunctionLayerParams> *)
             _UnaryFunctionLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::UpsampleLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::UpsampleLayerParams> *)
           _UpsampleLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ResizeBilinearLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ResizeBilinearLayerParams> *)
             _ResizeBilinearLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CropResizeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CropResizeLayerParams> *)
           _CropResizeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BiasLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::BiasLayerParams> *)
           _BiasLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ScaleLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ScaleLayerParams> *)
           _ScaleLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LoadConstantLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::LoadConstantLayerParams> *)
             _LoadConstantLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::L2NormalizeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::L2NormalizeLayerParams> *)
           _L2NormalizeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FlattenLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FlattenLayerParams> *)
           _FlattenLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReshapeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReshapeLayerParams> *)
           _ReshapeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PermuteLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::PermuteLayerParams> *)
           _PermuteLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ReorganizeDataLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ReorganizeDataLayerParams> *)
             _ReorganizeDataLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SliceLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SliceLayerParams> *)
           _SliceLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceLayerParams> *)
           _ReduceLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CropLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CropLayerParams> *)
           _CropLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AverageLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::AverageLayerParams> *)
           _AverageLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MaxLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MaxLayerParams> *)
             _MaxLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MinLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MinLayerParams> *)
             _MinLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DotProductLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::DotProductLayerParams> *)
           _DotProductLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MeanVarianceNormalizeLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MeanVarianceNormalizeLayerParams> *)
             _MeanVarianceNormalizeLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::SequenceRepeatLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SequenceRepeatLayerParams> *)
             _SequenceRepeatLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::SimpleRecurrentLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SimpleRecurrentLayerParams> *)
             _SimpleRecurrentLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GRULayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::GRULayerParams> *)
             _GRULayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LSTMParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LSTMParams> *)
             _LSTMParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LSTMWeightParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::LSTMWeightParams> *)
           _LSTMWeightParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::UniDirectionalLSTMLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::UniDirectionalLSTMLayerParams> *)
             _UniDirectionalLSTMLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::BiDirectionalLSTMLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::BiDirectionalLSTMLayerParams> *)
             _BiDirectionalLSTMLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
              *)_CustomLayerParams_CustomLayerParamValue_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CustomLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CustomLayerParams> *)
           _CustomLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TransposeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TransposeLayerParams> *)
           _TransposeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::BatchedMatMulLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::BatchedMatMulLayerParams> *)
             _BatchedMatMulLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ConcatNDLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ConcatNDLayerParams> *)
           _ConcatNDLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SoftmaxNDLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SoftmaxNDLayerParams> *)
           _SoftmaxNDLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReverseLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReverseLayerParams> *)
           _ReverseLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReverseSeqLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReverseSeqLayerParams> *)
           _ReverseSeqLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::LoadConstantNDLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LoadConstantNDLayerParams> *)
             _LoadConstantNDLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FillLikeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FillLikeLayerParams> *)
           _FillLikeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FillStaticLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FillStaticLayerParams> *)
           _FillStaticLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FillDynamicLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FillDynamicLayerParams> *)
           _FillDynamicLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::WhereBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::WhereBroadcastableLayerParams> *)
             _WhereBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SinLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SinLayerParams> *)
             _SinLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CosLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CosLayerParams> *)
             _CosLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TanLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::TanLayerParams> *)
             _TanLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AsinLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::AsinLayerParams> *)
           _AsinLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AcosLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::AcosLayerParams> *)
           _AcosLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AtanLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::AtanLayerParams> *)
           _AtanLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SinhLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SinhLayerParams> *)
           _SinhLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CoshLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CoshLayerParams> *)
           _CoshLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TanhLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TanhLayerParams> *)
           _TanhLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AsinhLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::AsinhLayerParams> *)
           _AsinhLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AcoshLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::AcoshLayerParams> *)
           _AcoshLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AtanhLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::AtanhLayerParams> *)
           _AtanhLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::PowBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::PowBroadcastableLayerParams> *)
             _PowBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Exp2LayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::Exp2LayerParams> *)
           _Exp2LayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::WhereNonZeroLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::WhereNonZeroLayerParams> *)
             _WhereNonZeroLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MatrixBandPartLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MatrixBandPartLayerParams> *)
             _MatrixBandPartLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::UpperTriangularLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::UpperTriangularLayerParams> *)
             _UpperTriangularLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::LowerTriangularLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LowerTriangularLayerParams> *)
             _LowerTriangularLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::BroadcastToLikeLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::BroadcastToLikeLayerParams> *)
             _BroadcastToLikeLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::BroadcastToStaticLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::BroadcastToStaticLayerParams> *)
             _BroadcastToStaticLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::BroadcastToDynamicLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::BroadcastToDynamicLayerParams> *)
             _BroadcastToDynamicLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::AddBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::AddBroadcastableLayerParams> *)
             _AddBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MaxBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MaxBroadcastableLayerParams> *)
             _MaxBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MinBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MinBroadcastableLayerParams> *)
             _MinBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ModBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ModBroadcastableLayerParams> *)
             _ModBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::FloorDivBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::FloorDivBroadcastableLayerParams> *)
             _FloorDivBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::SubtractBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SubtractBroadcastableLayerParams> *)
             _SubtractBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MultiplyBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MultiplyBroadcastableLayerParams> *)
             _MultiplyBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::DivideBroadcastableLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::DivideBroadcastableLayerParams> *)
             _DivideBroadcastableLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GatherLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::GatherLayerParams> *)
           _GatherLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ScatterLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ScatterLayerParams> *)
           _ScatterLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GatherNDLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::GatherNDLayerParams> *)
           _GatherNDLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ScatterNDLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ScatterNDLayerParams> *)
           _ScatterNDLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::GatherAlongAxisLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::GatherAlongAxisLayerParams> *)
             _GatherAlongAxisLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ScatterAlongAxisLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ScatterAlongAxisLayerParams> *)
             _ScatterAlongAxisLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::StackLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::StackLayerParams> *)
           _StackLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RankPreservingReshapeLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RankPreservingReshapeLayerParams> *)
             _RankPreservingReshapeLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ConstantPaddingLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ConstantPaddingLayerParams> *)
             _ConstantPaddingLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomNormalLikeLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomNormalLikeLayerParams> *)
             _RandomNormalLikeLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomNormalStaticLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomNormalStaticLayerParams> *)
             _RandomNormalStaticLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomNormalDynamicLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomNormalDynamicLayerParams> *)
             _RandomNormalDynamicLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomUniformLikeLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomUniformLikeLayerParams> *)
             _RandomUniformLikeLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomUniformStaticLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomUniformStaticLayerParams> *)
             _RandomUniformStaticLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomUniformDynamicLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomUniformDynamicLayerParams> *)
             _RandomUniformDynamicLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomBernoulliLikeLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomBernoulliLikeLayerParams> *)
             _RandomBernoulliLikeLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomBernoulliStaticLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomBernoulliStaticLayerParams> *)
             _RandomBernoulliStaticLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::RandomBernoulliDynamicLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::RandomBernoulliDynamicLayerParams> *)
             _RandomBernoulliDynamicLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CategoricalDistributionLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CategoricalDistributionLayerParams> *)
             _CategoricalDistributionLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceL1LayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceL1LayerParams> *)
           _ReduceL1LayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceL2LayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceL2LayerParams> *)
           _ReduceL2LayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceMaxLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceMaxLayerParams> *)
           _ReduceMaxLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceMinLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceMinLayerParams> *)
           _ReduceMinLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceSumLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceSumLayerParams> *)
           _ReduceSumLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceProdLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceProdLayerParams> *)
           _ReduceProdLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceMeanLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceMeanLayerParams> *)
           _ReduceMeanLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReduceLogSumLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::ReduceLogSumLayerParams> *)
             _ReduceLogSumLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ReduceSumSquareLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ReduceSumSquareLayerParams> *)
             _ReduceSumSquareLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ReduceLogSumExpLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ReduceLogSumExpLayerParams> *)
             _ReduceLogSumExpLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ExpandDimsLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ExpandDimsLayerParams> *)
           _ExpandDimsLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FlattenTo2DLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FlattenTo2DLayerParams> *)
           _FlattenTo2DLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReshapeStaticLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::ReshapeStaticLayerParams> *)
             _ReshapeStaticLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ReshapeLikeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ReshapeLikeLayerParams> *)
           _ReshapeLikeLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::ReshapeDynamicLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ReshapeDynamicLayerParams> *)
             _ReshapeDynamicLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SqueezeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SqueezeLayerParams> *)
           _SqueezeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TopKLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TopKLayerParams> *)
           _TopKLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ArgMaxLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ArgMaxLayerParams> *)
           _ArgMaxLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ArgMinLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ArgMinLayerParams> *)
           _ArgMinLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SplitNDLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SplitNDLayerParams> *)
           _SplitNDLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CeilLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CeilLayerParams> *)
           _CeilLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::RoundLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::RoundLayerParams> *)
           _RoundLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FloorLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FloorLayerParams> *)
           _FloorLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SignLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SignLayerParams> *)
           _SignLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ClipLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ClipLayerParams> *)
           _ClipLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SliceStaticLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SliceStaticLayerParams> *)
           _SliceStaticLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SliceDynamicLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::SliceDynamicLayerParams> *)
             _SliceDynamicLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TileLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TileLayerParams> *)
           _TileLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GetShapeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::GetShapeLayerParams> *)
           _GetShapeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ErfLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::ErfLayerParams> *)
             _ErfLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GeluLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::GeluLayerParams> *)
           _GeluLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::RangeStaticLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::RangeStaticLayerParams> *)
           _RangeStaticLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::RangeDynamicLayerParams>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::RangeDynamicLayerParams> *)
             _RangeDynamicLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::SlidingWindowsLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SlidingWindowsLayerParams> *)
             _SlidingWindowsLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::LayerNormalizationLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LayerNormalizationLayerParams> *)
             _LayerNormalizationLayerParams_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::NonMaximumSuppressionLayerParams>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::NonMaximumSuppressionLayerParams> *)
             _NonMaximumSuppressionLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ClampedReLULayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ClampedReLULayerParams> *)
           _ClampedReLULayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ArgSortLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ArgSortLayerParams> *)
           _ArgSortLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SliceBySizeLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SliceBySizeLayerParams> *)
           _SliceBySizeLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NeuralNetworkClassifier>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::NeuralNetworkClassifier> *)
             _NeuralNetworkClassifier_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::OneHotLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::OneHotLayerParams> *)
           _OneHotLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::CumSumLayerParams>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::CumSumLayerParams> *)
           _CumSumLayerParams_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NeuralNetworkRegressor>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::NeuralNetworkRegressor> *)
           _NeuralNetworkRegressor_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NetworkUpdateParameters>
  ::Shutdown((ExplicitlyConstructed<CoreML::Specification::NetworkUpdateParameters> *)
             _NetworkUpdateParameters_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LossLayer>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::LossLayer> *)_LossLayer_default_instance_
            );
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CategoricalCrossEntropyLossLayer>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CategoricalCrossEntropyLossLayer> *)
             _CategoricalCrossEntropyLossLayer_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MeanSquaredErrorLossLayer>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::MeanSquaredErrorLossLayer> *)
             _MeanSquaredErrorLossLayer_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Optimizer>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Optimizer> *)_Optimizer_default_instance_
            );
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SGDOptimizer>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::SGDOptimizer> *)
             _SGDOptimizer_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::AdamOptimizer>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::AdamOptimizer> *)
             _AdamOptimizer_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NeuralNetwork_default_instance_.Shutdown();
  _NeuralNetworkImageScaler_default_instance_.Shutdown();
  _NeuralNetworkMeanImage_default_instance_.Shutdown();
  _NeuralNetworkPreprocessing_default_instance_.Shutdown();
  _ActivationReLU_default_instance_.Shutdown();
  _ActivationLeakyReLU_default_instance_.Shutdown();
  _ActivationTanh_default_instance_.Shutdown();
  _ActivationScaledTanh_default_instance_.Shutdown();
  _ActivationSigmoid_default_instance_.Shutdown();
  _ActivationLinear_default_instance_.Shutdown();
  _ActivationSigmoidHard_default_instance_.Shutdown();
  _ActivationPReLU_default_instance_.Shutdown();
  _ActivationELU_default_instance_.Shutdown();
  _ActivationThresholdedReLU_default_instance_.Shutdown();
  _ActivationSoftsign_default_instance_.Shutdown();
  _ActivationSoftplus_default_instance_.Shutdown();
  _ActivationParametricSoftplus_default_instance_.Shutdown();
  _ActivationParams_default_instance_.Shutdown();
  _Tensor_default_instance_.Shutdown();
  _NeuralNetworkLayer_default_instance_.Shutdown();
  _BranchLayerParams_default_instance_.Shutdown();
  _LoopLayerParams_default_instance_.Shutdown();
  _LoopBreakLayerParams_default_instance_.Shutdown();
  _LoopContinueLayerParams_default_instance_.Shutdown();
  _CopyLayerParams_default_instance_.Shutdown();
  _GreaterThanLayerParams_default_instance_.Shutdown();
  _GreaterEqualLayerParams_default_instance_.Shutdown();
  _LessThanLayerParams_default_instance_.Shutdown();
  _LessEqualLayerParams_default_instance_.Shutdown();
  _EqualLayerParams_default_instance_.Shutdown();
  _NotEqualLayerParams_default_instance_.Shutdown();
  _LogicalAndLayerParams_default_instance_.Shutdown();
  _LogicalOrLayerParams_default_instance_.Shutdown();
  _LogicalXorLayerParams_default_instance_.Shutdown();
  _LogicalNotLayerParams_default_instance_.Shutdown();
  _BorderAmounts_EdgeSizes_default_instance_.Shutdown();
  _BorderAmounts_default_instance_.Shutdown();
  _ValidPadding_default_instance_.Shutdown();
  _SamePadding_default_instance_.Shutdown();
  _SamplingMode_default_instance_.Shutdown();
  _BoxCoordinatesMode_default_instance_.Shutdown();
  _WeightParams_default_instance_.Shutdown();
  _QuantizationParams_default_instance_.Shutdown();
  _LinearQuantizationParams_default_instance_.Shutdown();
  _LookUpTableQuantizationParams_default_instance_.Shutdown();
  _ConvolutionLayerParams_default_instance_.Shutdown();
  _Convolution3DLayerParams_default_instance_.Shutdown();
  _InnerProductLayerParams_default_instance_.Shutdown();
  _EmbeddingLayerParams_default_instance_.Shutdown();
  _EmbeddingNDLayerParams_default_instance_.Shutdown();
  _BatchnormLayerParams_default_instance_.Shutdown();
  _PoolingLayerParams_ValidCompletePadding_default_instance_.Shutdown();
  _PoolingLayerParams_default_instance_.Shutdown();
  _Pooling3DLayerParams_default_instance_.Shutdown();
  _GlobalPooling3DLayerParams_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingConstant_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReflection_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReplication_default_instance_.Shutdown();
  _PaddingLayerParams_default_instance_.Shutdown();
  _ConcatLayerParams_default_instance_.Shutdown();
  _LRNLayerParams_default_instance_.Shutdown();
  _SoftmaxLayerParams_default_instance_.Shutdown();
  _SplitLayerParams_default_instance_.Shutdown();
  _AddLayerParams_default_instance_.Shutdown();
  _MultiplyLayerParams_default_instance_.Shutdown();
  _UnaryFunctionLayerParams_default_instance_.Shutdown();
  _UpsampleLayerParams_default_instance_.Shutdown();
  _ResizeBilinearLayerParams_default_instance_.Shutdown();
  _CropResizeLayerParams_default_instance_.Shutdown();
  _BiasLayerParams_default_instance_.Shutdown();
  _ScaleLayerParams_default_instance_.Shutdown();
  _LoadConstantLayerParams_default_instance_.Shutdown();
  _L2NormalizeLayerParams_default_instance_.Shutdown();
  _FlattenLayerParams_default_instance_.Shutdown();
  _ReshapeLayerParams_default_instance_.Shutdown();
  _PermuteLayerParams_default_instance_.Shutdown();
  _ReorganizeDataLayerParams_default_instance_.Shutdown();
  _SliceLayerParams_default_instance_.Shutdown();
  _ReduceLayerParams_default_instance_.Shutdown();
  _CropLayerParams_default_instance_.Shutdown();
  _AverageLayerParams_default_instance_.Shutdown();
  _MaxLayerParams_default_instance_.Shutdown();
  _MinLayerParams_default_instance_.Shutdown();
  _DotProductLayerParams_default_instance_.Shutdown();
  _MeanVarianceNormalizeLayerParams_default_instance_.Shutdown();
  _SequenceRepeatLayerParams_default_instance_.Shutdown();
  _SimpleRecurrentLayerParams_default_instance_.Shutdown();
  _GRULayerParams_default_instance_.Shutdown();
  _LSTMParams_default_instance_.Shutdown();
  _LSTMWeightParams_default_instance_.Shutdown();
  _UniDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _BiDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _CustomLayerParams_CustomLayerParamValue_default_instance_.Shutdown();
  _CustomLayerParams_default_instance_.Shutdown();
  _TransposeLayerParams_default_instance_.Shutdown();
  _BatchedMatMulLayerParams_default_instance_.Shutdown();
  _ConcatNDLayerParams_default_instance_.Shutdown();
  _SoftmaxNDLayerParams_default_instance_.Shutdown();
  _ReverseLayerParams_default_instance_.Shutdown();
  _ReverseSeqLayerParams_default_instance_.Shutdown();
  _LoadConstantNDLayerParams_default_instance_.Shutdown();
  _FillLikeLayerParams_default_instance_.Shutdown();
  _FillStaticLayerParams_default_instance_.Shutdown();
  _FillDynamicLayerParams_default_instance_.Shutdown();
  _WhereBroadcastableLayerParams_default_instance_.Shutdown();
  _SinLayerParams_default_instance_.Shutdown();
  _CosLayerParams_default_instance_.Shutdown();
  _TanLayerParams_default_instance_.Shutdown();
  _AsinLayerParams_default_instance_.Shutdown();
  _AcosLayerParams_default_instance_.Shutdown();
  _AtanLayerParams_default_instance_.Shutdown();
  _SinhLayerParams_default_instance_.Shutdown();
  _CoshLayerParams_default_instance_.Shutdown();
  _TanhLayerParams_default_instance_.Shutdown();
  _AsinhLayerParams_default_instance_.Shutdown();
  _AcoshLayerParams_default_instance_.Shutdown();
  _AtanhLayerParams_default_instance_.Shutdown();
  _PowBroadcastableLayerParams_default_instance_.Shutdown();
  _Exp2LayerParams_default_instance_.Shutdown();
  _WhereNonZeroLayerParams_default_instance_.Shutdown();
  _MatrixBandPartLayerParams_default_instance_.Shutdown();
  _UpperTriangularLayerParams_default_instance_.Shutdown();
  _LowerTriangularLayerParams_default_instance_.Shutdown();
  _BroadcastToLikeLayerParams_default_instance_.Shutdown();
  _BroadcastToStaticLayerParams_default_instance_.Shutdown();
  _BroadcastToDynamicLayerParams_default_instance_.Shutdown();
  _AddBroadcastableLayerParams_default_instance_.Shutdown();
  _MaxBroadcastableLayerParams_default_instance_.Shutdown();
  _MinBroadcastableLayerParams_default_instance_.Shutdown();
  _ModBroadcastableLayerParams_default_instance_.Shutdown();
  _FloorDivBroadcastableLayerParams_default_instance_.Shutdown();
  _SubtractBroadcastableLayerParams_default_instance_.Shutdown();
  _MultiplyBroadcastableLayerParams_default_instance_.Shutdown();
  _DivideBroadcastableLayerParams_default_instance_.Shutdown();
  _GatherLayerParams_default_instance_.Shutdown();
  _ScatterLayerParams_default_instance_.Shutdown();
  _GatherNDLayerParams_default_instance_.Shutdown();
  _ScatterNDLayerParams_default_instance_.Shutdown();
  _GatherAlongAxisLayerParams_default_instance_.Shutdown();
  _ScatterAlongAxisLayerParams_default_instance_.Shutdown();
  _StackLayerParams_default_instance_.Shutdown();
  _RankPreservingReshapeLayerParams_default_instance_.Shutdown();
  _ConstantPaddingLayerParams_default_instance_.Shutdown();
  _RandomNormalLikeLayerParams_default_instance_.Shutdown();
  _RandomNormalStaticLayerParams_default_instance_.Shutdown();
  _RandomNormalDynamicLayerParams_default_instance_.Shutdown();
  _RandomUniformLikeLayerParams_default_instance_.Shutdown();
  _RandomUniformStaticLayerParams_default_instance_.Shutdown();
  _RandomUniformDynamicLayerParams_default_instance_.Shutdown();
  _RandomBernoulliLikeLayerParams_default_instance_.Shutdown();
  _RandomBernoulliStaticLayerParams_default_instance_.Shutdown();
  _RandomBernoulliDynamicLayerParams_default_instance_.Shutdown();
  _CategoricalDistributionLayerParams_default_instance_.Shutdown();
  _ReduceL1LayerParams_default_instance_.Shutdown();
  _ReduceL2LayerParams_default_instance_.Shutdown();
  _ReduceMaxLayerParams_default_instance_.Shutdown();
  _ReduceMinLayerParams_default_instance_.Shutdown();
  _ReduceSumLayerParams_default_instance_.Shutdown();
  _ReduceProdLayerParams_default_instance_.Shutdown();
  _ReduceMeanLayerParams_default_instance_.Shutdown();
  _ReduceLogSumLayerParams_default_instance_.Shutdown();
  _ReduceSumSquareLayerParams_default_instance_.Shutdown();
  _ReduceLogSumExpLayerParams_default_instance_.Shutdown();
  _ExpandDimsLayerParams_default_instance_.Shutdown();
  _FlattenTo2DLayerParams_default_instance_.Shutdown();
  _ReshapeStaticLayerParams_default_instance_.Shutdown();
  _ReshapeLikeLayerParams_default_instance_.Shutdown();
  _ReshapeDynamicLayerParams_default_instance_.Shutdown();
  _SqueezeLayerParams_default_instance_.Shutdown();
  _TopKLayerParams_default_instance_.Shutdown();
  _ArgMaxLayerParams_default_instance_.Shutdown();
  _ArgMinLayerParams_default_instance_.Shutdown();
  _SplitNDLayerParams_default_instance_.Shutdown();
  _CeilLayerParams_default_instance_.Shutdown();
  _RoundLayerParams_default_instance_.Shutdown();
  _FloorLayerParams_default_instance_.Shutdown();
  _SignLayerParams_default_instance_.Shutdown();
  _ClipLayerParams_default_instance_.Shutdown();
  _SliceStaticLayerParams_default_instance_.Shutdown();
  _SliceDynamicLayerParams_default_instance_.Shutdown();
  _TileLayerParams_default_instance_.Shutdown();
  _GetShapeLayerParams_default_instance_.Shutdown();
  _ErfLayerParams_default_instance_.Shutdown();
  _GeluLayerParams_default_instance_.Shutdown();
  _RangeStaticLayerParams_default_instance_.Shutdown();
  _RangeDynamicLayerParams_default_instance_.Shutdown();
  _SlidingWindowsLayerParams_default_instance_.Shutdown();
  _LayerNormalizationLayerParams_default_instance_.Shutdown();
  _NonMaximumSuppressionLayerParams_default_instance_.Shutdown();
  _ClampedReLULayerParams_default_instance_.Shutdown();
  _ArgSortLayerParams_default_instance_.Shutdown();
  _SliceBySizeLayerParams_default_instance_.Shutdown();
  _NeuralNetworkClassifier_default_instance_.Shutdown();
  _OneHotLayerParams_default_instance_.Shutdown();
  _CumSumLayerParams_default_instance_.Shutdown();
  _NeuralNetworkRegressor_default_instance_.Shutdown();
  _NetworkUpdateParameters_default_instance_.Shutdown();
  _LossLayer_default_instance_.Shutdown();
  _CategoricalCrossEntropyLossLayer_default_instance_.Shutdown();
  _MeanSquaredErrorLossLayer_default_instance_.Shutdown();
  _Optimizer_default_instance_.Shutdown();
  _SGDOptimizer_default_instance_.Shutdown();
  _AdamOptimizer_default_instance_.Shutdown();
}